

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTis.c
# Opt level: O1

void Gia_ManTisCollectMffc(Gia_Man_t *p,int Id,Vec_Int_t *vMffc,Vec_Int_t *vLeaves)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  if ((Id < 0) || (p->nObjs <= Id)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar4 = (uint)*(undefined8 *)(p->pObjs + (uint)Id);
  if ((-1 < (int)uVar4) && ((uVar4 & 0x1fffffff) != 0x1fffffff)) {
    pGVar1 = p->pObjs + (uint)Id;
    vMffc->nSize = 0;
    vLeaves->nSize = 0;
    Gia_ManIncrementTravId(p);
    Gia_ManTisCollectMffc_rec(p,Id - (*(uint *)pGVar1 & 0x1fffffff),vMffc,vLeaves);
    Gia_ManTisCollectMffc_rec(p,Id - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMffc,vLeaves);
    puVar3 = p->pMuxes;
    if ((puVar3 != (uint *)0x0) && (puVar3[(uint)Id] != 0)) {
      uVar4 = 0xffffffff;
      if (puVar3 != (uint *)0x0) {
        uVar2 = puVar3[(uint)Id];
        if (uVar2 != 0) {
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          uVar4 = uVar2 >> 1;
        }
      }
      Gia_ManTisCollectMffc_rec(p,uVar4,vMffc,vLeaves);
    }
    Vec_IntPush(vMffc,Id);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTis.c"
                ,0x7e,"void Gia_ManTisCollectMffc(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManTisCollectMffc( Gia_Man_t * p, int Id, Vec_Int_t * vMffc, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    assert( Gia_ObjIsAnd(pObj) );
    Vec_IntClear( vMffc );
    Vec_IntClear( vLeaves );
    Gia_ManIncrementTravId( p );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId0(pObj, Id), vMffc, vLeaves );
    Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId1(pObj, Id), vMffc, vLeaves );
    if ( Gia_ObjIsMuxId(p, Id) )
        Gia_ManTisCollectMffc_rec( p, Gia_ObjFaninId2(p, Id), vMffc, vLeaves );
    Vec_IntPush( vMffc, Id );
}